

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  int iVar1;
  stbi_uc *psVar2;
  byte bVar3;
  stbi_uc *psVar4;
  stbi_uc *psVar5;
  stbi_uc sVar6;
  uint uVar7;
  
  psVar5 = s->img_buffer;
  psVar2 = s->img_buffer_end;
  if (psVar5 < psVar2) {
    psVar4 = psVar5 + 1;
    s->img_buffer = psVar4;
    sVar6 = *psVar5;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00127e90;
    psVar5 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar6 = '\0';
    }
    else {
      psVar2 = psVar5 + iVar1;
      sVar6 = *psVar5;
    }
    s->img_buffer_end = psVar2;
    psVar4 = s->buffer_start + 1;
    s->img_buffer = psVar4;
  }
  if (sVar6 == 'G') {
    if (psVar4 < psVar2) {
      psVar5 = psVar4 + 1;
      s->img_buffer = psVar5;
      sVar6 = *psVar4;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00127e90;
      psVar5 = s->buffer_start;
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar1 == 0) {
        s->read_from_callbacks = 0;
        psVar2 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar6 = '\0';
      }
      else {
        psVar2 = psVar5 + iVar1;
        sVar6 = *psVar5;
      }
      s->img_buffer_end = psVar2;
      psVar5 = s->buffer_start + 1;
      s->img_buffer = psVar5;
    }
    if (sVar6 == 'I') {
      if (psVar5 < psVar2) {
        psVar4 = psVar5 + 1;
        s->img_buffer = psVar4;
        sVar6 = *psVar5;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00127e90;
        psVar5 = s->buffer_start;
        iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
        if (iVar1 == 0) {
          s->read_from_callbacks = 0;
          psVar2 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar6 = '\0';
        }
        else {
          psVar2 = psVar5 + iVar1;
          sVar6 = *psVar5;
        }
        s->img_buffer_end = psVar2;
        psVar4 = s->buffer_start + 1;
        s->img_buffer = psVar4;
      }
      if (sVar6 == 'F') {
        if (psVar4 < psVar2) {
          psVar5 = psVar4 + 1;
          s->img_buffer = psVar5;
          sVar6 = *psVar4;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_00127e90;
          psVar5 = s->buffer_start;
          iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
          if (iVar1 == 0) {
            s->read_from_callbacks = 0;
            psVar2 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar6 = '\0';
          }
          else {
            psVar2 = psVar5 + iVar1;
            sVar6 = *psVar5;
          }
          s->img_buffer_end = psVar2;
          psVar5 = s->buffer_start + 1;
          s->img_buffer = psVar5;
        }
        if (sVar6 == '8') {
          if (psVar5 < psVar2) {
            psVar4 = psVar5 + 1;
            s->img_buffer = psVar4;
            sVar6 = *psVar5;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_00127e90;
            psVar5 = s->buffer_start;
            iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
            if (iVar1 == 0) {
              s->read_from_callbacks = 0;
              psVar2 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar6 = '\0';
            }
            else {
              psVar2 = psVar5 + iVar1;
              sVar6 = *psVar5;
            }
            s->img_buffer_end = psVar2;
            psVar4 = s->buffer_start + 1;
            s->img_buffer = psVar4;
          }
          if ((sVar6 == '7') || (sVar6 == '9')) {
            if (psVar4 < psVar2) {
              s->img_buffer = psVar4 + 1;
              sVar6 = *psVar4;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_00127e90;
              psVar2 = s->buffer_start;
              iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
              if (iVar1 == 0) {
                s->read_from_callbacks = 0;
                psVar5 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar6 = '\0';
              }
              else {
                psVar5 = psVar2 + iVar1;
                sVar6 = *psVar2;
              }
              s->img_buffer_end = psVar5;
              s->img_buffer = s->buffer_start + 1;
            }
            if (sVar6 == 'a') {
              stbi__g_failure_reason = "";
              iVar1 = stbi__get16le(s);
              g->w = iVar1;
              iVar1 = stbi__get16le(s);
              g->h = iVar1;
              psVar5 = s->img_buffer;
              psVar2 = s->img_buffer_end;
              if (psVar5 < psVar2) {
                s->img_buffer = psVar5 + 1;
                bVar3 = *psVar5;
                psVar5 = psVar5 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar3 = 0;
              }
              else {
                psVar5 = s->buffer_start;
                iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
                if (iVar1 == 0) {
                  s->read_from_callbacks = 0;
                  psVar2 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  bVar3 = 0;
                }
                else {
                  psVar2 = psVar5 + iVar1;
                  bVar3 = *psVar5;
                }
                s->img_buffer_end = psVar2;
                psVar5 = s->buffer_start + 1;
                s->img_buffer = psVar5;
              }
              g->flags = (uint)bVar3;
              if (psVar5 < psVar2) {
                s->img_buffer = psVar5 + 1;
                uVar7 = (uint)*psVar5;
                psVar5 = psVar5 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar7 = 0;
              }
              else {
                psVar5 = s->buffer_start;
                iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
                if (iVar1 == 0) {
                  s->read_from_callbacks = 0;
                  psVar2 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  uVar7 = 0;
                }
                else {
                  psVar2 = psVar5 + iVar1;
                  uVar7 = (uint)*psVar5;
                }
                s->img_buffer_end = psVar2;
                psVar5 = s->buffer_start + 1;
                s->img_buffer = psVar5;
              }
              g->bgindex = uVar7;
              if (psVar5 < psVar2) {
                s->img_buffer = psVar5 + 1;
                bVar3 = *psVar5;
              }
              else if (s->read_from_callbacks == 0) {
                bVar3 = 0;
              }
              else {
                psVar2 = s->buffer_start;
                iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
                if (iVar1 == 0) {
                  s->read_from_callbacks = 0;
                  psVar5 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  bVar3 = 0;
                }
                else {
                  psVar5 = psVar2 + iVar1;
                  bVar3 = *psVar2;
                }
                s->img_buffer_end = psVar5;
                s->img_buffer = s->buffer_start + 1;
              }
              g->ratio = (uint)bVar3;
              g->transparent = -1;
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              if (is_info != 0) {
                return 1;
              }
              bVar3 = (byte)g->flags;
              if (-1 < (char)bVar3) {
                return 1;
              }
              stbi__gif_parse_colortable(s,g->pal,2 << (bVar3 & 7),-1);
              return 1;
            }
          }
        }
      }
    }
  }
LAB_00127e90:
  stbi__g_failure_reason = "Corrupt GIF";
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}